

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O0

uint64_t helper_punpcklhw_mips(uint64_t fs,uint64_t ft)

{
  undefined2 local_38;
  undefined2 uStack_36;
  LMIValue vt;
  LMIValue vs;
  LMIValue vd;
  uint host;
  uint64_t ft_local;
  uint64_t fs_local;
  
  vt.uh[0] = (uint16_t)fs;
  vs.uh[0] = vt.uh[0];
  local_38 = (uint16_t)ft;
  vs.uh[1] = local_38;
  vt.uh[1] = (uint16_t)(fs >> 0x10);
  vs.uh[2] = vt.uh[1];
  uStack_36 = (uint16_t)(ft >> 0x10);
  vs.uh[3] = uStack_36;
  return vs.d;
}

Assistant:

uint64_t helper_punpcklhw(uint64_t fs, uint64_t ft)
{
    unsigned host = BYTE_ORDER_XOR(3);
    LMIValue vd, vs, vt;

    vs.d = fs;
    vt.d = ft;
    vd.uh[0 ^ host] = vs.uh[0 ^ host];
    vd.uh[1 ^ host] = vt.uh[0 ^ host];
    vd.uh[2 ^ host] = vs.uh[1 ^ host];
    vd.uh[3 ^ host] = vt.uh[1 ^ host];

    return vd.d;
}